

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_Vx_annotation.cpp
# Opt level: O1

ON_DimRadial *
ON_DimRadial::CreateFromV5DimRadial
          (ON_OBSOLETE_V5_DimRadial *V5_radial_dimension,ON_3dmAnnotationContext *annotation_context
          ,ON_DimRadial *destination)

{
  V5_eAnnotationType VVar1;
  bool bVar2;
  ON_DimStyle *pOVar3;
  ON_Plane *this;
  ON_UUID *pOVar4;
  wchar_t *pwVar5;
  ON_OBSOLETE_V5_DimExtra *this_00;
  uint uVar6;
  ON_OBSOLETE_V5_Annotation *V5_annotation;
  double distance_scale;
  ON_UUID OVar7;
  ON_2dPoint OVar8;
  ON_2dPoint OVar9;
  ON_2dPoint OVar10;
  ON_wString usrtext;
  ON_3dPoint radius_point;
  ON_3dPoint center_point;
  ON_3dPoint dimline_point;
  
  if (annotation_context == (ON_3dmAnnotationContext *)0x0) {
    annotation_context = &ON_3dmAnnotationContext::Default;
  }
  pOVar3 = ON_3dmAnnotationContext::ParentDimStyle(annotation_context);
  if (destination == (ON_DimRadial *)0x0) {
    destination = (ON_DimRadial *)operator_new(0x390);
    ON_DimRadial(destination);
  }
  VVar1 = ON_OBSOLETE_V5_Annotation::Type(&V5_radial_dimension->super_ON_OBSOLETE_V5_Annotation);
  this = ON_OBSOLETE_V5_Annotation::Plane(&V5_radial_dimension->super_ON_OBSOLETE_V5_Annotation);
  OVar8 = ON_OBSOLETE_V5_Annotation::Point(&V5_radial_dimension->super_ON_OBSOLETE_V5_Annotation,0);
  OVar9 = ON_OBSOLETE_V5_Annotation::Point(&V5_radial_dimension->super_ON_OBSOLETE_V5_Annotation,1);
  OVar10 = ON_OBSOLETE_V5_Annotation::Point(&V5_radial_dimension->super_ON_OBSOLETE_V5_Annotation,2)
  ;
  pOVar4 = ON_ModelComponent::Id(&pOVar3->super_ON_ModelComponent);
  OVar7 = *pOVar4;
  ON_Plane::PointAt(&center_point,this,OVar8.x,OVar8.y);
  ON_Plane::PointAt(&radius_point,this,OVar9.x,OVar9.y);
  ON_Plane::PointAt(&dimline_point,this,OVar10.x,OVar10.y);
  uVar6 = (VVar1 == dtDimRadius) + 3;
  V5_annotation = (ON_OBSOLETE_V5_Annotation *)(ulong)uVar6;
  Create(destination,(AnnotationType)uVar6,OVar7,this,&center_point,&radius_point,&dimline_point);
  ON_Annotation::Internal_SetDimStyleFromV5Annotation
            ((ON_Annotation *)destination,V5_annotation,annotation_context);
  bVar2 = ON_OBSOLETE_V5_Annotation::UserPositionedText
                    (&V5_radial_dimension->super_ON_OBSOLETE_V5_Annotation);
  (*(destination->super_ON_Dimension).super_ON_Annotation.super_ON_Geometry.super_ON_Object.
    _vptr_ON_Object[0x2c])(destination,(ulong)!bVar2);
  pwVar5 = ON_OBSOLETE_V5_Annotation::TextFormula
                     (&V5_radial_dimension->super_ON_OBSOLETE_V5_Annotation);
  ON_wString::ON_wString(&usrtext,pwVar5);
  ON_wString::Replace(&usrtext,L"\\",L"\\\\");
  pwVar5 = ON_wString::Array(&usrtext);
  ON_Dimension::SetUserText(&destination->super_ON_Dimension,pwVar5);
  this_00 = ON_OBSOLETE_V5_DimExtra::DimensionExtension(V5_radial_dimension,false);
  if (this_00 != (ON_OBSOLETE_V5_DimExtra *)0x0) {
    OVar7 = ON_OBSOLETE_V5_DimExtra::DetailMeasured(this_00);
    ON_Dimension::SetDetailMeasured(&destination->super_ON_Dimension,OVar7);
    distance_scale = ON_OBSOLETE_V5_DimExtra::DistanceScale(this_00);
    ON_Dimension::SetDistanceScale(&destination->super_ON_Dimension,distance_scale);
  }
  ON_Annotation::SetDimTextLocation((ON_Annotation *)destination,pOVar3,InDimLine);
  ON_Annotation::SetLeaderContentAngleStyle((ON_Annotation *)destination,pOVar3,Horizontal);
  ON_DimStyle::ContentHash(pOVar3);
  pOVar3 = ON_Annotation::DimensionStyle((ON_Annotation *)destination,pOVar3);
  ON_DimStyle::ContentHash(pOVar3);
  ON_wString::~ON_wString(&usrtext);
  return destination;
}

Assistant:

ON_DimRadial* ON_DimRadial::CreateFromV5DimRadial(
    const class ON_OBSOLETE_V5_DimRadial& V5_radial_dimension,
    const class ON_3dmAnnotationContext* annotation_context,
    ON_DimRadial* destination
  )
{
  if (nullptr == annotation_context)
    annotation_context = &ON_3dmAnnotationContext::Default;

  const ON_DimStyle& parent_dim_style = annotation_context->ParentDimStyle();

  ON_DimRadial* V6_dim_radial
    = (nullptr != destination)
    ? destination
    : new ON_DimRadial();

  ON::AnnotationType radial_type = (ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimRadius == V5_radial_dimension.Type())
    ? ON::AnnotationType::Radius
    : ON::AnnotationType::Diameter;


  const ON_Plane& plane = V5_radial_dimension.Plane();
  ON_2dPoint center_pt = V5_radial_dimension.Point(ON_OBSOLETE_V5_DimRadial::POINT_INDEX::center_pt_index);
  ON_2dPoint arrow_pt = V5_radial_dimension.Point(ON_OBSOLETE_V5_DimRadial::POINT_INDEX::arrow_pt_index);
  ON_2dPoint tail_pt = V5_radial_dimension.Point(ON_OBSOLETE_V5_DimRadial::POINT_INDEX::tail_pt_index);
  //ON_2dPoint knee_pt = V5_radial_dimension.Point(ON_OBSOLETE_V5_DimRadial::POINT_INDEX::knee_pt_index);
  const ON_UUID styleid = parent_dim_style.Id();

  ON_3dPoint center_point = plane.PointAt(center_pt.x, center_pt.y);
  ON_3dPoint radius_point = plane.PointAt(arrow_pt.x, arrow_pt.y);
  //ON_3dPoint knee_point = plane.PointAt(knee_pt.x, knee_pt.y);
  ON_3dPoint dimline_point = plane.PointAt(tail_pt.x, tail_pt.y);

  V6_dim_radial->Create(radial_type, styleid, plane, center_point, radius_point, dimline_point);
  V6_dim_radial->Internal_SetDimStyleFromV5Annotation(V5_radial_dimension,annotation_context);


  V6_dim_radial->SetUseDefaultTextPoint(!V5_radial_dimension.UserPositionedText());
  ON_wString usrtext = V5_radial_dimension.TextFormula();
  usrtext.Replace(L"\\", L"\\\\");
  V6_dim_radial->SetUserText(usrtext.Array());
  
  const ON_OBSOLETE_V5_DimExtra* extra = ON_OBSOLETE_V5_DimExtra::DimensionExtension(const_cast<ON_OBSOLETE_V5_DimRadial*>(&V5_radial_dimension), false);
  if (nullptr != extra)
  {
    V6_dim_radial->SetDetailMeasured(extra->DetailMeasured());
    V6_dim_radial->SetDistanceScale(extra->DistanceScale());
  }

  // V5 radial dimensions had this behavior which is non-default in V6
  V6_dim_radial->SetDimTextLocation(&parent_dim_style, ON_DimStyle::TextLocation::InDimLine);
  V6_dim_radial->SetLeaderContentAngleStyle(&parent_dim_style, ON_DimStyle::ContentAngleStyle::Horizontal);

  // updates any m_overrides to be current and updates content hash.
  parent_dim_style.ContentHash();
  V6_dim_radial->DimensionStyle(parent_dim_style).ContentHash();

  return V6_dim_radial;
}